

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

ClockingSkewSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ClockingSkewSyntax,slang::parsing::Token&,slang::syntax::TimingControlSyntax*&>
          (BumpAllocator *this,Token *args,TimingControlSyntax **args_1)

{
  Token edge;
  ClockingSkewSyntax *this_00;
  TimingControlSyntax **args_local_1;
  Token *args_local;
  BumpAllocator *this_local;
  
  this_00 = (ClockingSkewSyntax *)allocate(this,0x28,8);
  edge.kind = args->kind;
  edge._2_1_ = args->field_0x2;
  edge.numFlags.raw = (args->numFlags).raw;
  edge.rawLen = args->rawLen;
  edge.info = args->info;
  slang::syntax::ClockingSkewSyntax::ClockingSkewSyntax(this_00,edge,*args_1);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }